

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void filter_16_2t_pixels(__m256i *sig,__m256i *f,__m256i *y0,__m256i *y1)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m256i x1;
  __m256i x0;
  __m256i rounding;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  auVar6 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar6 = vpinsrd_avx(auVar6,0x40,2);
  auVar6 = vpinsrd_avx(auVar6,0x40,3);
  auVar5 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar5 = vpinsrd_avx(auVar5,0x40,2);
  auVar5 = vpinsrd_avx(auVar5,0x40,3);
  auVar5 = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar5;
  auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uStack_170 = auVar6._0_8_;
  uStack_168 = auVar6._8_8_;
  auVar1 = vpmaddwd_avx2(*in_RDI,*in_RSI);
  auVar2 = vpmaddwd_avx2(in_RDI[1],*in_RSI);
  auVar4._16_8_ = uStack_170;
  auVar4._0_16_ = auVar5;
  auVar4._24_8_ = uStack_168;
  auVar1 = vpaddd_avx2(auVar1,auVar4);
  auVar3._16_8_ = uStack_170;
  auVar3._0_16_ = auVar5;
  auVar3._24_8_ = uStack_168;
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416(7));
  *in_RDX = auVar1;
  auVar1 = vpsrad_avx2(auVar2,ZEXT416(7));
  *in_RCX = auVar1;
  return;
}

Assistant:

static inline void filter_16_2t_pixels(const __m256i *sig, const __m256i *f,
                                       __m256i *y0, __m256i *y1) {
  const __m256i rounding = _mm256_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
  __m256i x0 = _mm256_madd_epi16(sig[0], *f);
  __m256i x1 = _mm256_madd_epi16(sig[1], *f);
  x0 = _mm256_add_epi32(x0, rounding);
  x1 = _mm256_add_epi32(x1, rounding);
  *y0 = _mm256_srai_epi32(x0, CONV8_ROUNDING_BITS);
  *y1 = _mm256_srai_epi32(x1, CONV8_ROUNDING_BITS);
}